

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O1

void mkgarden(level *lev,mkroom *croom)

{
  undefined1 *puVar1;
  bool bVar2;
  xchar xVar3;
  xchar xVar4;
  rm (*parVar5) [21];
  boolean bVar6;
  uint uVar7;
  uint uVar8;
  permonst *ptr;
  monst *pmVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  mkroom *croom_00;
  schar *psVar13;
  coord pos;
  coord local_6a;
  level *local_68;
  uint local_5c;
  mkroom *local_58;
  monst *(*local_50) [21];
  mkroom *local_48;
  d_level *local_40;
  rm (*local_38) [21];
  
  local_48 = lev->rooms;
  local_50 = lev->monsters;
  local_40 = &lev->z;
  local_38 = lev->locations;
  uVar8 = 1;
  bVar2 = false;
  local_68 = lev;
  local_58 = croom;
  do {
    croom_00 = local_58;
    if (local_58 == (mkroom *)0x0) {
      iVar12 = local_68->nroom;
      uVar7 = mt_random();
      croom_00 = local_48 + SUB168(ZEXT416(uVar7) % SEXT816((long)iVar12),0);
      lev = local_68;
    }
    local_5c = uVar8;
    if ((-1 < croom_00->hx) &&
       ((local_58 != (mkroom *)0x0 ||
        ((((((croom_00->rtype == '\0' && (croom_00->rlit != '\0')) &&
            (lev->upstairs_room != croom_00)) &&
           ((((lev->sstairs).sx == '\0' || ((lev->sstairs).up == '\0')) ||
            (lev->sstairs_room != croom_00)))) && (lev->dnstairs_room != croom_00)) &&
         ((((lev->sstairs).sx == '\0' || ((lev->sstairs).up != '\0')) ||
          (lev->sstairs_room != croom_00)))))))) {
      croom_00->rtype = '\x0e';
      puVar1 = &(lev->flags).field_0x8;
      *puVar1 = *puVar1 | 0x20;
      uVar8 = mt_random();
      iVar12 = uVar8 % 5 + 3;
      uVar8 = 1;
      while (bVar6 = somexy(lev,croom_00,&local_6a), xVar4 = local_6a.y, xVar3 = local_6a.x,
            bVar6 != '\0') {
        if (((local_50[local_6a.x][local_6a.y] == (monst *)0x0) ||
            ((local_50[local_6a.x][local_6a.y]->field_0x61 & 2) != 0)) &&
           (ptr = mkclass(local_40,'\x0e',0), ptr != (permonst *)0x0)) {
          pmVar9 = makemon(ptr,lev,(int)xVar3,(int)xVar4,0);
          if (pmVar9 != (monst *)0x0) {
            pmVar9->field_0x62 = pmVar9->field_0x62 | 8;
          }
          iVar12 = iVar12 + -1;
        }
        if ((0x31 < uVar8) || (uVar8 = uVar8 + 1, iVar12 < 0)) break;
      }
      uVar8 = mt_random();
      iVar12 = uVar8 % 3 + 3;
      uVar8 = 1;
      while( true ) {
        bVar6 = somexy(lev,croom_00,&local_6a);
        parVar5 = local_38;
        bVar2 = true;
        if (bVar6 == '\0') break;
        lVar11 = (long)local_6a.x;
        lVar10 = (long)local_6a.y;
        if (((local_38[lVar11][lVar10].typ == '\x19') &&
            ((local_50[lVar11][lVar10] == (monst *)0x0 ||
             ((local_50[lVar11][lVar10]->field_0x61 & 2) != 0)))) &&
           (bVar6 = nexttodoor(local_68,(int)local_6a.x,(int)local_6a.y), bVar6 == '\0')) {
          psVar13 = &parVar5[lVar11][lVar10].typ;
          uVar7 = mt_random();
          if (uVar7 * -0x55555555 < 0x55555556) {
            *psVar13 = '\x1c';
            (local_68->flags).nfountains = (local_68->flags).nfountains + '\x01';
          }
          else {
            *psVar13 = '\r';
          }
          iVar12 = iVar12 + -1;
        }
        lev = local_68;
        if ((0x31 < uVar8) || (uVar8 = uVar8 + 1, iVar12 < 0)) break;
      }
    }
    if ((0x18 < local_5c) || (uVar8 = local_5c + 1, bVar2)) {
      return;
    }
  } while( true );
}

Assistant:

static void mkgarden(struct level *lev, struct mkroom *croom)
{
	int tryct = 0;
	boolean maderoom = FALSE;
	coord pos;
	int i, tried;

	while ((tryct++ < 25) && !maderoom) {
	    struct mkroom *sroom = croom ? croom : &lev->rooms[rn2(lev->nroom)];

	    if (sroom->hx < 0 || (!croom &&
		    (sroom->rtype != OROOM || !sroom->rlit ||
		    has_upstairs(lev, sroom) || has_dnstairs(lev, sroom))))
		continue;

	    sroom->rtype = GARDEN;
	    maderoom = TRUE;
	    lev->flags.has_garden = 1;

	    tried = 0;
	    i = rn1(5, 3);
	    while ((tried++ < 50) && (i >= 0) && somexy(lev, sroom, &pos)) {
		const struct permonst *pmon;
		if (!MON_AT(lev, pos.x, pos.y) && (pmon = mkclass(&lev->z, S_NYMPH, 0))) {
		    struct monst *mtmp = makemon(pmon, lev, pos.x, pos.y, NO_MM_FLAGS);
		    if (mtmp) mtmp->msleeping = 1;
		    i--;
		}
	    }

	    tried = 0;
	    i = rn1(3, 3);
	    while ((tried++ < 50) && (i >= 0) && somexy(lev, sroom, &pos)) {
		if (lev->locations[pos.x][pos.y].typ == ROOM && !MON_AT(lev, pos.x, pos.y) &&
			!nexttodoor(lev, pos.x, pos.y)) {
		    if (rn2(3)) {
			lev->locations[pos.x][pos.y].typ = TREE;
		    } else {
			lev->locations[pos.x][pos.y].typ = FOUNTAIN;
			lev->flags.nfountains++;
		    }
		    i--;
		}
	    }
	}
}